

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O2

int __thiscall
bdConnectManager::checkExistingConnectionAttempt(bdConnectManager *this,bdNodeId *target)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdConnectionRequest>,_std::_Select1st<std::pair<const_bdNodeId,_bdConnectionRequest>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
          ::find(&(this->mConnectionRequests)._M_t,target);
  return (int)((_Rb_tree_header *)iVar1._M_node !=
              &(this->mConnectionRequests)._M_t._M_impl.super__Rb_tree_header);
}

Assistant:

int bdConnectManager::checkExistingConnectionAttempt(bdNodeId *target) {
	std::map<bdNodeId, bdConnectionRequest>::iterator it;
	it = mConnectionRequests.find(*target);
	if (it != mConnectionRequests.end()) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::checkExistingConnectAttempt() Found Existing Connection!";
		std::cerr << std::endl;
#endif
		return 1;
	}
	return 0;
}